

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O3

void __thiscall QAbstractAnimation::~QAbstractAnimation(QAbstractAnimation *this)

{
  QUntypedPropertyData *data;
  QBindingStorage *this_00;
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  QAbstractAnimation *in_stack_ffffffffffffffa8;
  int local_50;
  undefined4 local_4c;
  void *local_48;
  undefined4 *local_40;
  int *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_0069d238;
  lVar1 = *(long *)(this + 8);
  data = (QUntypedPropertyData *)(lVar1 + 0x78);
  this_00 = (QBindingStorage *)(lVar1 + 0x40);
  if ((*(long **)(lVar1 + 0x48) != (long *)0x0) && (**(long **)(lVar1 + 0x48) != 0)) {
    QBindingStorage::registerDependency_helper(this_00,data);
  }
  iVar2 = *(int *)data;
  if (iVar2 != 0) {
    if ((*(long **)(lVar1 + 0x48) != (long *)0x0) && (**(long **)(lVar1 + 0x48) != 0)) {
      QBindingStorage::registerDependency_helper(this_00,data);
      iVar2 = *(int *)data;
    }
    QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
    ::setValue((QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
                *)data,Stopped);
    QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
    ::notify((QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
              *)data);
    if ((*(long **)(lVar1 + 0x48) != (long *)0x0) && (**(long **)(lVar1 + 0x48) != 0)) {
      QBindingStorage::registerDependency_helper(this_00,data);
    }
    local_4c = *(undefined4 *)data;
    local_40 = &local_4c;
    local_38 = &local_50;
    local_48 = (void *)0x0;
    local_50 = iVar2;
    QMetaObject::activate((QObject *)this,&staticMetaObject,1,&local_48);
    if (iVar2 == 2) {
      QAnimationTimer::unregisterAnimation(in_stack_ffffffffffffffa8);
    }
  }
  if (*(QAnimationGroup **)(lVar1 + 0x98) != (QAnimationGroup *)0x0) {
    QAnimationGroup::removeAnimation(*(QAnimationGroup **)(lVar1 + 0x98),(QAbstractAnimation *)this)
    ;
  }
  QObject::~QObject((QObject *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractAnimation::~QAbstractAnimation()
{
    Q_D(QAbstractAnimation);
    //we can't call stop here. Otherwise we get pure virtual calls
    if (d->state != Stopped) {
        QAbstractAnimation::State oldState = d->state;
        d->state = Stopped;
        d->state.notify();
        emit stateChanged(d->state, oldState);
        if (oldState == QAbstractAnimation::Running)
            QAnimationTimer::unregisterAnimation(this);
    }
    if (d->group)
        d->group->removeAnimation(this);
}